

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_iwmmxt_setpsr_nz(TCGContext_conflict1 *tcg_ctx)

{
  TCGv_i32 var;
  uintptr_t o;
  TCGTemp *local_18;
  
  var = tcg_temp_new_i32(tcg_ctx);
  local_18 = (TCGTemp *)(tcg_ctx->cpu_M0 + (long)tcg_ctx);
  tcg_gen_callN_aarch64
            (tcg_ctx,helper_iwmmxt_setpsr_nz_aarch64,(TCGTemp *)(var + (long)&tcg_ctx->pool_cur),1,
             &local_18);
  store_cpu_offset(tcg_ctx,var,0x2fac);
  return;
}

Assistant:

static void gen_op_iwmmxt_setpsr_nz(TCGContext *tcg_ctx)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    gen_helper_iwmmxt_setpsr_nz(tcg_ctx, tmp, tcg_ctx->cpu_M0);
    store_cpu_field(tcg_ctx, tmp, iwmmxt.cregs[ARM_IWMMXT_wCASF]);
}